

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeGroup::SingleVertexArrayNormalizeGroup
          (SingleVertexArrayNormalizeGroup *this,Context *context,InputType type)

{
  char *description;
  undefined1 auVar1 [12];
  string local_60;
  string local_40;
  InputType local_1c;
  Context *pCStack_18;
  InputType type_local;
  Context *context_local;
  SingleVertexArrayNormalizeGroup *this_local;
  
  local_1c = type;
  pCStack_18 = context;
  context_local = (Context *)this;
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_40,(Array *)(ulong)type,type);
  auVar1 = std::__cxx11::string::c_str();
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_60,(Array *)(ulong)local_1c,auVar1._8_4_);
  description = (char *)std::__cxx11::string::c_str();
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,context,auVar1._0_8_,description);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleVertexArrayNormalizeGroup_0159a2d8;
  this->m_type = local_1c;
  return;
}

Assistant:

SingleVertexArrayNormalizeGroup::SingleVertexArrayNormalizeGroup (Context& context, Array::InputType type)
	: TestCaseGroup	(context, Array::inputTypeToString(type).c_str(), Array::inputTypeToString(type).c_str())
	, m_type		(type)
{
}